

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highwayhash_test_target.cc
# Opt level: O0

void highwayhash::anon_unknown_0::TestHighwayHashCat<unsigned_long[4]>
               (HHKey *key,char *bytes,size_t size,unsigned_long (*expected) [4],HHNotify notify)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong in_RDX;
  char *in_RSI;
  HHKey *in_RDI;
  HHNotify in_R8;
  size_t total_size;
  unsigned_long result_cat [4];
  char *pos;
  HighwayHashCatT<2U> cat;
  size_t size3;
  size_t size2;
  size_t size1;
  size_t max_fragment_size;
  HHStateT<2> state_flat;
  size_t i;
  unsigned_long (*results) [4];
  unsigned_long local_230 [5];
  char *local_208;
  HighwayHashCatT<2U> local_200;
  ulong local_130;
  ulong local_128;
  ulong local_120;
  ulong local_118;
  HHStateSSE41 local_110;
  ulong local_88;
  void *local_80;
  HHNotify local_78;
  ulong local_68;
  char *local_60;
  HHKey *local_58;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = in_RDX + 1;
  uVar2 = SUB168(auVar1 * ZEXT816(0x20),0);
  if (SUB168(auVar1 * ZEXT816(0x20),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  local_78 = in_R8;
  local_68 = in_RDX;
  local_60 = in_RSI;
  local_58 = in_RDI;
  local_80 = operator_new__(uVar2);
  for (local_88 = 0; local_88 <= local_68; local_88 = local_88 + 1) {
    SSE41::HHStateSSE41::HHStateSSE41(&local_110,*local_58);
    HighwayHashT<highwayhash::SSE41::HHStateSSE41,unsigned_long[4]>
              (&local_110,local_60,local_88,
               (unsigned_long (*) [4])((long)local_80 + local_88 * 0x20));
  }
  local_118 = local_68 / 3;
  for (local_120 = 0; local_120 < local_118; local_120 = local_120 + 1) {
    for (local_128 = 0; local_128 < local_118; local_128 = local_128 + 1) {
      for (local_130 = 0; local_130 < local_118; local_130 = local_130 + 1) {
        HighwayHashCatT<2U>::HighwayHashCatT(&local_200,local_58);
        local_208 = local_60;
        HighwayHashCatT<2U>::Append(&local_200,local_60,local_120);
        local_208 = local_208 + local_120;
        HighwayHashCatT<2U>::Append(&local_200,local_208,local_128);
        local_208 = local_208 + local_128;
        HighwayHashCatT<2U>::Append(&local_200,local_208,local_130);
        local_208 = local_208 + local_130;
        HighwayHashCatT<2U>::Finalize<unsigned_long[4]>(&local_200,(unsigned_long (*) [4])local_230)
        ;
        (anonymous_namespace)::NotifyIfUnequal<4ul>
                  ((long)local_208 - (long)local_60,
                   (uint64_t (*) [4])((long)local_80 + ((long)local_208 - (long)local_60) * 0x20),
                   (uint64_t (*) [4])local_230,local_78);
      }
    }
  }
  if (local_80 != (void *)0x0) {
    operator_delete__(local_80);
  }
  return;
}

Assistant:

void TestHighwayHashCat(const HHKey& key, const char* HH_RESTRICT bytes,
                        const size_t size, const Result* expected,
                        const HHNotify notify) {
  // TODO(janwas): investigate (length=33)
#if HH_TARGET == HH_TARGET_Portable && HH_GCC_VERSION && !HH_CLANG_VERSION
  return;
#endif

  // Slightly faster to compute the expected prefix hashes only once.
  // Use new instead of vector to avoid headers with inline functions.
  Result* results = new Result[size + 1];
  for (size_t i = 0; i <= size; ++i) {
    HHStateT<HH_TARGET> state_flat(key);
    HighwayHashT(&state_flat, bytes, i, &results[i]);
  }

  // Splitting into three fragments/Append should cover all codepaths.
  const size_t max_fragment_size = size / 3;
  for (size_t size1 = 0; size1 < max_fragment_size; ++size1) {
    for (size_t size2 = 0; size2 < max_fragment_size; ++size2) {
      for (size_t size3 = 0; size3 < max_fragment_size; ++size3) {
        HighwayHashCatT<HH_TARGET> cat(key);
        const char* pos = bytes;
        cat.Append(pos, size1);
        pos += size1;
        cat.Append(pos, size2);
        pos += size2;
        cat.Append(pos, size3);
        pos += size3;

        Result result_cat;
        cat.Finalize(&result_cat);

        const size_t total_size = pos - bytes;
        NotifyIfUnequal(total_size, results[total_size], result_cat, notify);
      }
    }
  }

  delete[] results;
}